

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,TPZVec<double> *par,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  double *pdVar6;
  int *piVar7;
  TPZFMatrix<double> *this_00;
  TPZManVector<double,_10> *this_01;
  TPZBaseMatrix *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  double *in_R9;
  double dVar8;
  REAL RVar9;
  _func_int **pp_Var10;
  long *in_stack_00000008;
  TPZFNMatrix<9,_double> axest;
  int c;
  int b_2;
  int a_3;
  int a_2;
  int b_1;
  int a_1;
  int b;
  TPZManVector<double,_10> parChanged;
  int a;
  TPZManVector<double,_3> DblendTemp;
  REAL blendTemp;
  int sidedim;
  TPZFNMatrix<9,_double> Inv;
  int dim;
  TPZGeoElSide neighbyside;
  int byside;
  TPZGeoMesh *gmesh;
  REAL Det;
  TPZFNMatrix<9,_double> Jneighbourhood;
  TPZFNMatrix<9,_double> JacTemp;
  TPZFNMatrix<9,_double> Ax;
  TPZFNMatrix<9,_double> J2;
  TPZFNMatrix<9,_double> J1;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  TPZStack<int,_10> LowAllSides;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_10> SidesCounter;
  int majorSide;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> SidePar;
  TPZManVector<double,_3> NeighPar;
  TPZGeoEl *gel;
  TPZFMatrix<double> *in_stack_fffffffffffff208;
  TPZManVector<double,_10> *in_stack_fffffffffffff210;
  TPZGeoMesh *in_stack_fffffffffffff218;
  undefined4 in_stack_fffffffffffff220;
  int in_stack_fffffffffffff224;
  undefined4 uVar11;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffff228;
  TPZFNMatrix<24,_double> *in_stack_fffffffffffff230;
  double *in_stack_fffffffffffff238;
  TPZManVector<double,_10> *in_stack_fffffffffffff240;
  TPZMatrix<double> *in_stack_fffffffffffff248;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff250;
  undefined8 in_stack_fffffffffffff258;
  TPZFMatrix<double> *in_stack_fffffffffffff260;
  TPZFMatrix<double> *in_stack_fffffffffffff268;
  TPZGeoElSide *in_stack_fffffffffffff270;
  TPZFMatrix<double> *in_stack_fffffffffffff2b0;
  TPZFMatrix<double> *in_stack_fffffffffffff300;
  TPZFMatrix<double> *in_stack_fffffffffffff308;
  TPZFMatrix<double> *in_stack_fffffffffffff310;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  int local_b90;
  int local_b8c;
  int local_b14;
  TPZFMatrix<double> *in_stack_fffffffffffff4f8;
  TPZVec<double> *in_stack_fffffffffffff500;
  TPZVec<double> *in_stack_fffffffffffff508;
  int in_stack_fffffffffffff510;
  int in_stack_fffffffffffff514;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffff518;
  double local_ad0;
  TPZGeoElSide local_990;
  int local_974;
  TPZGeoMesh *local_970;
  undefined8 local_880;
  TPZVec<int> local_248 [2];
  int *local_200 [3];
  TPZFMatrix<double> *in_stack_fffffffffffffe18;
  REAL *in_stack_fffffffffffffe20;
  TPZFMatrix<double> *in_stack_fffffffffffffe28;
  TPZFMatrix<double> *in_stack_fffffffffffffe30;
  TPZVec<double> *in_stack_fffffffffffffe38;
  TPZGeoElSide *in_stack_fffffffffffffe40;
  TPZVec<double> local_1b0 [3];
  int local_13c;
  undefined8 local_138;
  undefined8 local_f8;
  TPZVec<double> local_f0 [5];
  TPZGeoEl *local_38;
  double *local_30;
  TPZBaseMatrix *local_20;
  TPZVec<double> *local_18;
  
  local_38 = *(TPZGeoEl **)(in_RDI + 0x18);
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff230,(int64_t)in_stack_fffffffffffff228
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff230,(int64_t)in_stack_fffffffffffff228
            );
  local_f8 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff240,(int64_t)in_stack_fffffffffffff238
             ,(double *)in_stack_fffffffffffff230);
  local_138 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff240,(int64_t)in_stack_fffffffffffff238
             ,(double *)in_stack_fffffffffffff230);
  local_13c = 2;
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffff240,(int64_t)in_stack_fffffffffffff238,
             (double *)in_stack_fffffffffffff230);
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_fffffffffffff230,(int64_t)in_stack_fffffffffffff228,
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_fffffffffffff230,(int64_t)in_stack_fffffffffffff228,
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  pztopology::TPZLine::Shape
            (&in_stack_fffffffffffff210->super_TPZVec<double>,in_stack_fffffffffffff208,
             (TPZFMatrix<double> *)0x165ad2b);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220)
            );
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220)
            );
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220)
            );
  local_880 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff250,(int64_t)in_stack_fffffffffffff248,
             (int64_t)in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220)
            );
  local_970 = TPZGeoEl::Mesh(local_38);
  for (local_974 = local_13c; 1 < local_974; local_974 = local_974 + -1) {
    Neighbour(in_stack_fffffffffffff228,in_stack_fffffffffffff224,in_stack_fffffffffffff218);
    iVar4 = TPZGeoElSide::Exists(&local_990);
    if (iVar4 != 0) {
      pztopology::TPZLine::LowerDimensionSides
                (in_stack_fffffffffffff224,(TPZStack<int,_10> *)in_stack_fffffffffffff218,
                 (int)((ulong)in_stack_fffffffffffff210 >> 0x20));
      pztopology::TPZLine::LowerDimensionSides
                (in_stack_fffffffffffff224,(TPZStack<int,_10> *)in_stack_fffffffffffff218);
      Neighbour(in_stack_fffffffffffff228,in_stack_fffffffffffff224,in_stack_fffffffffffff218);
      TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff210);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x165ae9c);
      TPZFNMatrix<9,_double>::TPZFNMatrix
                ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff230,
                 (int64_t)in_stack_fffffffffffff228,
                 CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
      TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff210);
      bVar3 = MapToNeighSide<double>
                        (in_stack_fffffffffffff518,in_stack_fffffffffffff514,
                         in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                         in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      if (bVar3) {
        Neighbour(in_stack_fffffffffffff228,in_stack_fffffffffffff224,in_stack_fffffffffffff218);
        TPZGeoElSide::X(in_stack_fffffffffffff270,(TPZVec<double> *)in_stack_fffffffffffff268,
                        (TPZVec<double> *)in_stack_fffffffffffff260);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x165b14d);
        Neighbour(in_stack_fffffffffffff228,in_stack_fffffffffffff224,in_stack_fffffffffffff218);
        TPZGeoElSide::Jacobian
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x165b1b7);
        TPZFMatrix<double>::Transpose(in_stack_fffffffffffff2b0);
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                   in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20));
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                   in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20));
        local_ad0 = 0.0;
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)in_stack_fffffffffffff240,
                   (int64_t)in_stack_fffffffffffff238,(double *)in_stack_fffffffffffff230);
        for (local_b14 = 0; iVar5 = TPZVec<int>::NElements((TPZVec<int> *)&local_248[2].fStore),
            local_b14 < iVar5; local_b14 = local_b14 + 1) {
          TPZVec<double>::NElements(local_18);
          TPZManVector<double,_10>::TPZManVector
                    ((TPZManVector<double,_10> *)in_stack_fffffffffffff230,
                     (int64_t)in_stack_fffffffffffff228);
          pztopology::TPZLine::Shape
                    (&in_stack_fffffffffffff210->super_TPZVec<double>,in_stack_fffffffffffff208,
                     (TPZFMatrix<double> *)0x165b2d2);
          TPZVec<int>::operator[]((TPZVec<int> *)&local_248[2].fStore,(long)local_b14);
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff228,
                              CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
          local_ad0 = *pdVar6 + local_ad0;
          for (local_b8c = 0; local_b8c < 1; local_b8c = local_b8c + 1) {
            TPZVec<int>::operator[]((TPZVec<int> *)&local_248[2].fStore,(long)local_b14);
            in_stack_fffffffffffff310 =
                 (TPZFMatrix<double> *)
                 TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff228,
                            CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            in_stack_fffffffffffff300 =
                 (TPZFMatrix<double> *)
                 (in_stack_fffffffffffff310->super_TPZMatrix<double>).super_TPZBaseMatrix.
                 super_TPZSavable._vptr_TPZSavable;
            in_stack_fffffffffffff308 =
                 (TPZFMatrix<double> *)
                 TPZVec<double>::operator[]
                           ((TPZVec<double> *)&stack0xfffffffffffff4f8,(long)local_b8c);
            (in_stack_fffffffffffff308->super_TPZMatrix<double>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)
                 ((double)in_stack_fffffffffffff300 +
                 (double)(in_stack_fffffffffffff308->super_TPZMatrix<double>).super_TPZBaseMatrix.
                         super_TPZSavable._vptr_TPZSavable);
          }
          TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffff210);
        }
        for (local_b90 = 0; local_b90 < 3; local_b90 = local_b90 + 1) {
          for (local_b94 = 0; local_b94 < 1; local_b94 = local_b94 + 1) {
            pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_974);
            dVar8 = *pdVar6;
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff228,
                                CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            dVar1 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[](local_f0,(long)local_b90);
            dVar2 = *pdVar6;
            pdVar6 = TPZVec<double>::operator[]
                               ((TPZVec<double> *)&stack0xfffffffffffff4f8,(long)local_b94);
            in_stack_fffffffffffff2b0 = (TPZFMatrix<double> *)(dVar1 * local_ad0 + dVar2 * *pdVar6);
            pdVar6 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff228,
                                CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            *pdVar6 = (1.0 - dVar8) * (double)in_stack_fffffffffffff2b0 + *pdVar6;
          }
        }
        for (local_b98 = 0; iVar5 = TPZVec<int>::NElements(local_248), local_b98 < iVar5;
            local_b98 = local_b98 + 1) {
          pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_974);
          dVar8 = *pdVar6;
          piVar7 = TPZVec<int>::operator[](local_248,(long)local_b98);
          pdVar6 = TPZVec<double>::operator[](local_1b0,(long)*piVar7);
          *pdVar6 = (1.0 - dVar8) + *pdVar6;
        }
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff210)
        ;
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165b7aa);
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x165b7ed);
  }
  for (local_b9c = 0; local_b9c < 2; local_b9c = local_b9c + 1) {
    for (local_ba0 = 0; local_ba0 < 3; local_ba0 = local_ba0 + 1) {
      for (local_ba4 = 0; local_ba4 < 1; local_ba4 = local_ba4 + 1) {
        pdVar6 = TPZVec<double>::operator[](local_1b0,(long)local_b9c);
        dVar8 = 1.0 - *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff228,
                            CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
        dVar8 = dVar8 * *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff228,
                            CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
        in_stack_fffffffffffff248 = (TPZMatrix<double> *)*pdVar6;
        in_stack_fffffffffffff250 =
             (TPZFNMatrix<9,_double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff230->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff228,
                        CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
        (in_stack_fffffffffffff250->super_TPZFMatrix<double>).super_TPZMatrix<double>.
        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)
             (dVar8 * (double)in_stack_fffffffffffff248 +
             (double)(in_stack_fffffffffffff250->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
      }
    }
  }
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220)
            );
  TPZFMatrix<double>::GramSchmidt
            (in_stack_fffffffffffff310,in_stack_fffffffffffff308,in_stack_fffffffffffff300);
  TPZFMatrix<double>::Transpose
            (&in_stack_fffffffffffff250->super_TPZFMatrix<double>,in_stack_fffffffffffff248);
  iVar5 = TPZBaseMatrix::Rows(local_20);
  this_00 = (TPZFMatrix<double> *)TPZBaseMatrix::Cols(local_20);
  (**(code **)(*in_stack_00000008 + 0x68))(in_stack_00000008,iVar5,this_00);
  pdVar6 = TPZFMatrix<double>::operator()
                     (this_00,(int64_t)in_stack_fffffffffffff228,
                      CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  *local_30 = *pdVar6;
  bVar3 = IsZero(*local_30);
  uVar11 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff224);
  if (bVar3) {
    RVar9 = ZeroTolerance();
    *local_30 = RVar9;
  }
  pp_Var10 = (_func_int **)(1.0 / *local_30);
  this_01 = (TPZManVector<double,_10> *)
            TPZFMatrix<double>::operator()
                      (this_00,(int64_t)pdVar6,CONCAT44(uVar11,in_stack_fffffffffffff220));
  (this_01->super_TPZVec<double>)._vptr_TPZVec = pp_Var10;
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb26);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb33);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb40);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb4d);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb5a);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x165bb67);
  TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x165bb74);
  TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x165bb81);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x165bb8e);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x165bb9b);
  TPZManVector<double,_10>::~TPZManVector(this_01);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}